

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_texture_size_variants
          (CompilerHLSL *this,uint64_t variant_mask,char *vecsize_qualifier,bool uav,
          char *type_qualifier)

{
  uint32_t uVar1;
  char *local_60;
  char *local_58;
  char *local_50;
  ulong local_48;
  uint64_t mask;
  uint local_38;
  uint32_t bit;
  uint32_t type_index;
  uint32_t index;
  char *type_qualifier_local;
  char *pcStack_20;
  bool uav_local;
  char *vecsize_qualifier_local;
  uint64_t variant_mask_local;
  CompilerHLSL *this_local;
  
  if (variant_mask != 0) {
    _type_index = type_qualifier;
    type_qualifier_local._7_1_ = uav;
    pcStack_20 = vecsize_qualifier;
    vecsize_qualifier_local = (char *)variant_mask;
    variant_mask_local = (uint64_t)this;
    for (bit = 0; bit < 10; bit = bit + 1) {
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        mask._4_4_ = local_38 * 0x10 + bit;
        local_48 = 1L << ((byte)mask._4_4_ & 0x3f);
        if (((ulong)vecsize_qualifier_local & local_48) != 0) {
          local_50 = "Texture";
          if ((type_qualifier_local._7_1_ & 1) != 0) {
            local_50 = "Image";
          }
          local_58 = "";
          if ((type_qualifier_local._7_1_ & 1) != 0) {
            local_58 = "RW";
          }
          local_60 = "uint Level, ";
          if ((type_qualifier_local._7_1_ & 1) != 0) {
            local_60 = "";
          }
          CompilerGLSL::
          statement<char_const*&,char_const(&)[5],char_const*,char_const(&)[6],char_const*,char_const*&,char_const(&)[2],char_const*&,char_const*&,char_const*&,char_const(&)[8],char_const*,char_const(&)[16]>
                    (&this->super_CompilerGLSL,emit_texture_size_variants::ret_types + bit,
                     (char (*) [5])" spv",&local_50,(char (*) [6])0x4109d4,&local_58,
                     emit_texture_size_variants::dims + bit,(char (*) [2])0x421795,
                     (char **)&type_index,emit_texture_size_variants::types + local_38,
                     &stack0xffffffffffffffe0,(char (*) [8])"> Tex, ",&local_60,
                     (char (*) [16])"out uint Param)");
          CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
          CompilerGLSL::statement<char_const*&,char_const(&)[6]>
                    (&this->super_CompilerGLSL,emit_texture_size_variants::ret_types + bit,
                     (char (*) [6])0x40f593);
          uVar1 = emit_texture_size_variants::return_arguments[bit];
          if (uVar1 == 1) {
            if (((emit_texture_size_variants::has_lod[bit] & 1U) == 0) ||
               ((type_qualifier_local._7_1_ & 1) != 0)) {
              CompilerGLSL::statement<char_const(&)[26]>
                        (&this->super_CompilerGLSL,(char (*) [26])"Tex.GetDimensions(ret.x);");
              CompilerGLSL::statement<char_const(&)[12]>
                        (&this->super_CompilerGLSL,(char (*) [12])"Param = 0u;");
            }
            else {
              CompilerGLSL::statement<char_const(&)[40]>
                        (&this->super_CompilerGLSL,
                         (char (*) [40])"Tex.GetDimensions(Level, ret.x, Param);");
            }
          }
          else if (uVar1 == 2) {
            if (((emit_texture_size_variants::has_lod[bit] & 1U) == 0) ||
               ((type_qualifier_local._7_1_ & 1) != 0)) {
              if ((type_qualifier_local._7_1_ & 1) == 0) {
                CompilerGLSL::statement<char_const(&)[40]>
                          (&this->super_CompilerGLSL,
                           (char (*) [40])"Tex.GetDimensions(ret.x, ret.y, Param);");
              }
              else {
                CompilerGLSL::statement<char_const(&)[33]>
                          (&this->super_CompilerGLSL,
                           (char (*) [33])"Tex.GetDimensions(ret.x, ret.y);");
                CompilerGLSL::statement<char_const(&)[12]>
                          (&this->super_CompilerGLSL,(char (*) [12])"Param = 0u;");
              }
            }
            else {
              CompilerGLSL::statement<char_const(&)[47]>
                        (&this->super_CompilerGLSL,
                         (char (*) [47])"Tex.GetDimensions(Level, ret.x, ret.y, Param);");
            }
          }
          else if (uVar1 == 3) {
            if (((emit_texture_size_variants::has_lod[bit] & 1U) == 0) ||
               ((type_qualifier_local._7_1_ & 1) != 0)) {
              if ((type_qualifier_local._7_1_ & 1) == 0) {
                CompilerGLSL::statement<char_const(&)[47]>
                          (&this->super_CompilerGLSL,
                           (char (*) [47])"Tex.GetDimensions(ret.x, ret.y, ret.z, Param);");
              }
              else {
                CompilerGLSL::statement<char_const(&)[40]>
                          (&this->super_CompilerGLSL,
                           (char (*) [40])"Tex.GetDimensions(ret.x, ret.y, ret.z);");
                CompilerGLSL::statement<char_const(&)[12]>
                          (&this->super_CompilerGLSL,(char (*) [12])"Param = 0u;");
              }
            }
            else {
              CompilerGLSL::statement<char_const(&)[54]>
                        (&this->super_CompilerGLSL,
                         (char (*) [54])"Tex.GetDimensions(Level, ret.x, ret.y, ret.z, Param);");
            }
          }
          CompilerGLSL::statement<char_const(&)[12]>
                    (&this->super_CompilerGLSL,(char (*) [12])"return ret;");
          CompilerGLSL::end_scope(&this->super_CompilerGLSL);
          CompilerGLSL::statement<char_const(&)[1]>
                    (&this->super_CompilerGLSL,(char (*) [1])0x400321);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerHLSL::emit_texture_size_variants(uint64_t variant_mask, const char *vecsize_qualifier, bool uav,
                                              const char *type_qualifier)
{
	if (variant_mask == 0)
		return;

	static const char *types[QueryTypeCount] = { "float", "int", "uint" };
	static const char *dims[QueryDimCount] = { "Texture1D",   "Texture1DArray",  "Texture2D",   "Texture2DArray",
		                                       "Texture3D",   "Buffer",          "TextureCube", "TextureCubeArray",
		                                       "Texture2DMS", "Texture2DMSArray" };

	static const bool has_lod[QueryDimCount] = { true, true, true, true, true, false, true, true, false, false };

	static const char *ret_types[QueryDimCount] = {
		"uint", "uint2", "uint2", "uint3", "uint3", "uint", "uint2", "uint3", "uint2", "uint3",
	};

	static const uint32_t return_arguments[QueryDimCount] = {
		1, 2, 2, 3, 3, 1, 2, 3, 2, 3,
	};

	for (uint32_t index = 0; index < QueryDimCount; index++)
	{
		for (uint32_t type_index = 0; type_index < QueryTypeCount; type_index++)
		{
			uint32_t bit = 16 * type_index + index;
			uint64_t mask = 1ull << bit;

			if ((variant_mask & mask) == 0)
				continue;

			statement(ret_types[index], " spv", (uav ? "Image" : "Texture"), "Size(", (uav ? "RW" : ""),
			          dims[index], "<", type_qualifier, types[type_index], vecsize_qualifier, "> Tex, ",
			          (uav ? "" : "uint Level, "), "out uint Param)");
			begin_scope();
			statement(ret_types[index], " ret;");
			switch (return_arguments[index])
			{
			case 1:
				if (has_lod[index] && !uav)
					statement("Tex.GetDimensions(Level, ret.x, Param);");
				else
				{
					statement("Tex.GetDimensions(ret.x);");
					statement("Param = 0u;");
				}
				break;
			case 2:
				if (has_lod[index] && !uav)
					statement("Tex.GetDimensions(Level, ret.x, ret.y, Param);");
				else if (!uav)
					statement("Tex.GetDimensions(ret.x, ret.y, Param);");
				else
				{
					statement("Tex.GetDimensions(ret.x, ret.y);");
					statement("Param = 0u;");
				}
				break;
			case 3:
				if (has_lod[index] && !uav)
					statement("Tex.GetDimensions(Level, ret.x, ret.y, ret.z, Param);");
				else if (!uav)
					statement("Tex.GetDimensions(ret.x, ret.y, ret.z, Param);");
				else
				{
					statement("Tex.GetDimensions(ret.x, ret.y, ret.z);");
					statement("Param = 0u;");
				}
				break;
			}

			statement("return ret;");
			end_scope();
			statement("");
		}
	}
}